

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FillRightConcaveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Point *pb;
  Orientation OVar1;
  Node *node_00;
  
  node_00 = node->next;
  while( true ) {
    Fill(this,tcx,node_00);
    node_00 = node->next;
    pb = node_00->point;
    if (pb == edge->p) {
      return;
    }
    OVar1 = Orient2d(edge->q,pb,edge->p);
    if (OVar1 != CCW) break;
    OVar1 = Orient2d(node->point,pb,node_00->next->point);
    if (OVar1 != CCW) {
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillRightConcaveEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  Fill(tcx, *node.next);
  if (node.next->point != edge->p) {
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.next->point, *edge->p) == CCW) {
      // Below
      if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
        // Next is concave
        FillRightConcaveEdgeEvent(tcx, edge, node);
      } else {
        // Next is convex
      }
    }
  }

}